

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Ability_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  char *pcVar1;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t val_1;
  uint32_t val;
  uint64_t w;
  char *mark;
  void *pval;
  flatcc_builder_ref_t ref;
  int more;
  void *struct_base_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  _ref = (char *)struct_base;
  struct_base_local = end;
  end_local = buf;
  buf_local = (char *)ctx;
  end_local = flatcc_json_parser_object_start(ctx,buf,end,(int *)((long)&pval + 4));
  do {
    if (pval._4_4_ == 0) {
      return end_local;
    }
    end_local = flatcc_json_parser_symbol_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    _val_1 = flatcc_json_parser_symbol_part(end_local,(char *)struct_base_local);
    if ((_val_1 & 0xffff000000000000) == 0x6964000000000000) {
      w = (uint64_t)end_local;
      end_local = flatcc_json_parser_match_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,2
                            );
      if ((char *)w == end_local) {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
      else {
        local_54 = 0;
        mark = _ref;
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_uint32
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,&local_54);
        if (((char *)w == end_local) &&
           ((w = (uint64_t)end_local,
            end_local = flatcc_json_parser_symbolic_uint32
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,
                                   MyGame_Example_Ability_parse_json_struct_inline::symbolic_parsers
                                   ,&local_54), end_local == (char *)w ||
            (end_local == (char *)struct_base_local)))) {
LAB_0010b8a9:
          pcVar1 = flatcc_json_parser_set_error
                             ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,
                              0x23);
          return pcVar1;
        }
        flatbuffers_uint32_write_to_pe(mark,local_54);
      }
    }
    else if (_val_1 == 0x64697374616e6365) {
      w = (uint64_t)end_local;
      end_local = flatcc_json_parser_match_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,8
                            );
      if ((char *)w == end_local) {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
      else {
        local_58 = 0;
        mark = _ref + 4;
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_uint32
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,&local_58);
        if (((char *)w == end_local) &&
           ((w = (uint64_t)end_local,
            end_local = flatcc_json_parser_symbolic_uint32
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,
                                   MyGame_Example_Ability_parse_json_struct_inline::
                                   symbolic_parsers_1,&local_58), end_local == (char *)w ||
            (end_local == (char *)struct_base_local)))) goto LAB_0010b8a9;
        flatbuffers_uint32_write_to_pe(mark,local_58);
      }
    }
    else {
      end_local = flatcc_json_parser_unmatched_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    }
    end_local = flatcc_json_parser_object_end
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,
                           (int *)((long)&pval + 4));
  } while( true );
}

Assistant:

static const char *MyGame_Example_Ability_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if ((w & 0xffff000000000000) == 0x6964000000000000) { /* "id" */
            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
            if (mark != buf) {
                uint32_t val = 0;
                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                        monster_test_local_MyGame_Example_json_parser_enum,
                        monster_test_global_json_parser_enum, 0 };
                pval = (void *)((size_t)struct_base + 0);
                buf = flatcc_json_parser_uint32(ctx, (mark = buf), end, &val);
                if (mark == buf) {
                    buf = flatcc_json_parser_symbolic_uint32(ctx, (mark = buf), end, symbolic_parsers, &val);
                    if (buf == mark || buf == end) goto failed;
                }
                flatbuffers_uint32_write_to_pe(pval, val);
            } else {
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            }
        } else { /* "id" */
            if (w == 0x64697374616e6365) { /* "distance" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 8);
                if (mark != buf) {
                    uint32_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 4);
                    buf = flatcc_json_parser_uint32(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint32(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_uint32_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "distance" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "distance" */
        } /* "id" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}